

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O1

int t3_compare_case_fold(char *a,size_t alen,char *b,size_t blen,size_t *bmatchlen)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  Utf8FoldStr bp;
  Utf8FoldStr ap;
  Utf8FoldStr local_80;
  Utf8FoldStr local_58;
  
  pwVar1 = local_58.ie;
  local_58.fp = local_58.ie + 1;
  local_58.ie[1] = L'\0';
  pwVar2 = local_80.ie;
  local_80.fp = local_80.ie + 1;
  local_80.ie[1] = L'\0';
  local_80.fpbase = pwVar2;
  local_80.p.p_ = b;
  local_80.rem = blen;
  local_58.fpbase = pwVar1;
  local_58.p.p_ = a;
  local_58.rem = alen;
  while (((local_58.rem != 0 || (*local_58.fp != L'\0' || local_58.fp == pwVar1)) &&
         ((local_80.rem != 0 || (*local_80.fp != L'\0' || local_80.fp == pwVar2))))) {
    wVar3 = Utf8FoldStr::getch(&local_58);
    wVar4 = Utf8FoldStr::getch(&local_80);
    if (wVar3 - wVar4 != 0) {
      return wVar3 - wVar4;
    }
  }
  if (bmatchlen != (size_t *)0x0) {
    if (local_58.rem != 0) {
      return 1;
    }
    if (((local_58.fp != pwVar1 && *local_58.fp == L'\0') && (local_80.fp != local_80.fpbase)) &&
       (*local_80.fp == L'\0')) {
      *bmatchlen = (long)local_80.p.p_ - (long)b;
      return 0;
    }
  }
  if (local_58.rem != 0) {
    return 1;
  }
  if (local_58.fp == pwVar1 || *local_58.fp != L'\0') {
    return 1;
  }
  if (local_80.rem != 0) {
    return -1;
  }
  if (*local_80.fp != L'\0') {
    return -1;
  }
  return -(uint)(local_80.fp == pwVar2);
}

Assistant:

int t3_compare_case_fold(
    const char *a, size_t alen,
    const char *b, size_t blen, size_t *bmatchlen)
{
    /* set up folded-case string readers for the two strings */
    Utf8FoldStr ap(a, alen), bp(b, blen);

    /* scan until we find a mismatch or run out of one string */
    while(ap.more() && bp.more())
    {
        /* get the next character of each string */
        wchar_t ach = ap.getch(), bch = bp.getch();

        /* if they're different, return the sign difference */
        if (ach != bch)
            return ach - bch;
    }

    /* 
     *   if 'a' ran out first, and we have a 'bmatchlen' pointer, then we're
     *   being asked if 'a' is a leading substring of 'b', which it is - fill
     *   in '*bmatchlen' with the length of 'b' that we matched, and return
     *   ture 
     */
    if (bmatchlen != 0 && !ap.more() && bp.at_boundary())
    {
        *bmatchlen = bp.getptr() - b;
        return 0;
    }

    /* which ran out first was shorter, so sorts first */
    return ap.more() ? 1 : bp.more() ? -1 : 0;
}